

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_db_cacheflush(sqlite3 *db)

{
  int iVar1;
  Btree *pBVar2;
  Pager *p;
  PgHdr *pPVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  PgHdr *pPg;
  int iVar8;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  bVar4 = false;
  lVar5 = 0;
  do {
    lVar7 = lVar5;
    iVar1 = db->nDb;
    if (iVar1 <= lVar7) {
      iVar8 = 0;
      break;
    }
    pBVar2 = db->aDb[lVar7].pBt;
    iVar8 = 0;
    if ((pBVar2 != (Btree *)0x0) && (pBVar2->inTrans == '\x02')) {
      p = pBVar2->pBt->pPager;
      iVar8 = p->errCode;
      if ((p->memDb == '\0') &&
         (pPg = sqlite3PcacheDirtyList(p->pPCache), pPg != (PgHdr *)0x0 && iVar8 == 0)) {
        do {
          pPVar3 = pPg->pDirty;
          iVar8 = 0;
          if (pPg->nRef == 0) {
            iVar8 = pagerStress(p,pPg);
          }
        } while ((iVar8 == 0) && (pPg = pPVar3, pPVar3 != (PgHdr *)0x0));
      }
      if (iVar8 == 5) {
        bVar4 = true;
        iVar8 = 0;
      }
    }
    lVar5 = lVar7 + 1;
  } while (iVar8 == 0);
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  iVar6 = 5;
  if (!bVar4) {
    iVar6 = iVar8;
  }
  if (lVar7 < iVar1) {
    iVar6 = iVar8;
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_db_cacheflush(sqlite3 *db){
  int i;
  int rc = SQLITE_OK;
  int bSeenBusy = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt && sqlite3BtreeIsInTrans(pBt) ){
      Pager *pPager = sqlite3BtreePager(pBt);
      rc = sqlite3PagerFlush(pPager);
      if( rc==SQLITE_BUSY ){
        bSeenBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return ((rc==SQLITE_OK && bSeenBusy) ? SQLITE_BUSY : rc);
}